

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_comparator.cpp
# Opt level: O2

int bidfx_public_api::price::subject::SubjectComparatorUtils::CompareQuantity(string *s1,string *s2)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  exception e;
  
  uVar1 = CompareObject(s1,s2);
  if (uVar1 == 2) {
    dVar2 = std::__cxx11::stod(s1,(size_t *)0x0);
    dVar3 = std::__cxx11::stod(s2,(size_t *)0x0);
    uVar1 = 0xffffffff;
    if (dVar3 <= dVar2) {
      uVar1 = -(uint)(dVar2 != dVar3) & 1;
    }
  }
  return uVar1;
}

Assistant:

int SubjectComparatorUtils::CompareQuantity(const std::string& s1, const std::string& s2)
{
    int cmp = CompareObject(s1, s2);
    if (cmp != BOTH_NON_NULL) return cmp;
    try
    {
        double val1 = std::stod(s1);
        double val2 = std::stod(s2);

        if (val1 < val2) return -1;
        return val1 == val2 ? 0 : 1;
    }
    catch (std::exception e)
    {
        return s1.compare(s2);
    }
}